

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O2

void Fxu_ListCubeAddLiteral(Fxu_Cube *pCube,Fxu_Lit *pLink)

{
  int *piVar1;
  Fxu_Lit *pFVar2;
  
  if ((pCube->lLits).pHead == (Fxu_Lit *)0x0) {
    (pCube->lLits).pHead = pLink;
    (pCube->lLits).pTail = pLink;
    pLink->pHNext = (Fxu_Lit *)0x0;
    pFVar2 = (Fxu_Lit *)0x0;
  }
  else {
    pLink->pHNext = (Fxu_Lit *)0x0;
    pFVar2 = (pCube->lLits).pTail;
    pFVar2->pHNext = pLink;
    (pCube->lLits).pTail = pLink;
  }
  pLink->pHPrev = pFVar2;
  piVar1 = &(pCube->lLits).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListCubeAddLiteral( Fxu_Cube * pCube, Fxu_Lit * pLink )
{
    Fxu_ListLit * pList = &(pCube->lLits);
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pHPrev = NULL;
        pLink->pHNext = NULL;
    }
    else
    {
        pLink->pHNext = NULL;
        pList->pTail->pHNext = pLink;
        pLink->pHPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}